

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockContextGenNodeID(ImGuiContext *ctx)

{
  ImGuiDockNode *pIVar1;
  undefined4 local_14;
  ImGuiID id;
  ImGuiContext *ctx_local;
  
  local_14 = 1;
  while( true ) {
    pIVar1 = DockContextFindNodeByID(ctx,local_14);
    if (pIVar1 == (ImGuiDockNode *)0x0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

ImGuiID ImGui::DockContextGenNodeID(ImGuiContext* ctx)
{
    // Generate an ID for new node (the exact ID value doesn't matter as long as it is not already used)
    // FIXME-OPT FIXME-DOCK: This is suboptimal, even if the node count is small enough not to be a worry. We should poke in ctx->Nodes to find a suitable ID faster.
    ImGuiID id = 0x0001;
    while (DockContextFindNodeByID(ctx, id) != NULL)
        id++;
    return id;
}